

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O3

void __thiscall duckdb::MetaPipeline::Ready(MetaPipeline *this)

{
  pointer psVar1;
  pointer prVar2;
  PhysicalOperator *pPVar3;
  pointer psVar4;
  Pipeline *pPVar5;
  pointer prVar6;
  MetaPipeline *this_00;
  pointer prVar7;
  shared_ptr<duckdb::Pipeline,_true> *pipeline;
  pointer this_01;
  pointer this_02;
  
  psVar1 = (this->pipelines).
           super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (this->pipelines).
                 super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                 .
                 super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != psVar1; this_01 = this_01 + 1
      ) {
    pPVar5 = shared_ptr<duckdb::Pipeline,_true>::operator->(this_01);
    if (pPVar5->ready == false) {
      pPVar5->ready = true;
      prVar2 = (pPVar5->operators).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      prVar7 = (pPVar5->operators).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      prVar6 = prVar7 + -1;
      if (prVar2 < prVar6 && prVar2 != prVar7) {
        do {
          prVar7 = prVar2 + 1;
          pPVar3 = prVar2->_M_data;
          prVar2->_M_data = prVar6->_M_data;
          prVar6->_M_data = pPVar3;
          prVar6 = prVar6 + -1;
          prVar2 = prVar7;
        } while (prVar7 < prVar6);
      }
    }
  }
  psVar4 = (this->children).
           super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (this->children).
                 super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
                 .
                 super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_02 != psVar4; this_02 = this_02 + 1
      ) {
    this_00 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(this_02);
    Ready(this_00);
  }
  return;
}

Assistant:

void MetaPipeline::Ready() const {
	for (auto &pipeline : pipelines) {
		pipeline->Ready();
	}
	for (auto &child : children) {
		child->Ready();
	}
}